

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O1

void icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
               (AffixPatternProvider *patternInfo,bool isPrefix,int8_t signum,
               UNumberSignDisplay signDisplay,Form plural,bool perMilleReplacesPercent,
               UnicodeString *output)

{
  ushort uVar1;
  ushort uVar2;
  UChar UVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  UChar UVar7;
  Form FVar8;
  undefined4 in_register_0000000c;
  undefined3 in_register_00000089;
  byte bVar9;
  int iVar10;
  byte local_48;
  UChar local_42;
  Form local_40;
  undefined4 local_3c;
  undefined8 local_38;
  
  local_3c = CONCAT31(in_register_00000089,perMilleReplacesPercent);
  local_38 = CONCAT44(in_register_0000000c,signDisplay);
  if ((signum == -1) ||
     (((signDisplay != UNUM_SIGN_ALWAYS && (signDisplay != UNUM_SIGN_ACCOUNTING_ALWAYS)) &&
      (1 < signDisplay - UNUM_SIGN_EXCEPT_ZERO || signum != '\x01')))) {
    local_48 = 0;
  }
  else {
    iVar4 = (*patternInfo->_vptr_AffixPatternProvider[6])(patternInfo);
    local_48 = (byte)iVar4 ^ 1;
  }
  uVar5 = (*patternInfo->_vptr_AffixPatternProvider[7])(patternInfo);
  if ((char)uVar5 == '\x01' && signum != -1) {
    iVar4 = (*patternInfo->_vptr_AffixPatternProvider[8])(patternInfo);
    uVar5 = (uint)((byte)iVar4 & local_48);
  }
  FVar8 = (uVar5 & 0xff) * 0x200;
  local_40 = FVar8 + 0x100;
  if (!isPrefix) {
    local_40 = FVar8;
  }
  if (plural == COUNT) {
    plural = ZERO;
  }
  local_40 = plural | local_40;
  bVar9 = 0;
  if ((char)uVar5 == '\0' && isPrefix) {
    bVar9 = (int)local_38 != 2;
    if (signum != -1) {
      bVar9 = local_48;
    }
  }
  iVar4 = (*patternInfo->_vptr_AffixPatternProvider[3])(patternInfo,(ulong)local_40);
  uVar5 = (uint)bVar9;
  uVar1 = (output->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = 2;
  if ((uVar1 & 1) == 0) {
    uVar2 = uVar1 & 0x1e;
  }
  (output->fUnion).fStackFields.fLengthAndFlags = uVar2;
  iVar10 = iVar4 + uVar5;
  if (iVar10 != 0 && SCARRY4(iVar4,uVar5) == iVar10 < 0) {
    iVar4 = 0;
    do {
      UVar3 = L'-';
      if ((bVar9 & iVar4 == 0) == 0) {
        iVar6 = (*patternInfo->_vptr_AffixPatternProvider[2])
                          (patternInfo,(ulong)local_40,(ulong)(iVar4 - uVar5));
        UVar3 = (UChar)iVar6;
      }
      UVar7 = L'+';
      if (UVar3 != L'-') {
        UVar7 = UVar3;
      }
      if (local_48 != 0) {
        UVar3 = UVar7;
      }
      local_42 = UVar3;
      if ((char)local_3c != '\0') {
        local_42 = L'‰';
      }
      if (UVar3 != L'%') {
        local_42 = UVar3;
      }
      UnicodeString::doAppend(output,&local_42,0,1);
      iVar4 = iVar4 + 1;
    } while (iVar10 != iVar4);
  }
  return;
}

Assistant:

void PatternStringUtils::patternInfoToStringBuilder(const AffixPatternProvider& patternInfo, bool isPrefix,
                                                    int8_t signum, UNumberSignDisplay signDisplay,
                                                    StandardPlural::Form plural,
                                                    bool perMilleReplacesPercent, UnicodeString& output) {

    // Should the output render '+' where '-' would normally appear in the pattern?
    bool plusReplacesMinusSign = signum != -1 && (
            signDisplay == UNUM_SIGN_ALWAYS || signDisplay == UNUM_SIGN_ACCOUNTING_ALWAYS || (
                    signum == 1 && (
                            signDisplay == UNUM_SIGN_EXCEPT_ZERO ||
                            signDisplay == UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO))) &&
                                 patternInfo.positiveHasPlusSign() == false;

    // Should we use the affix from the negative subpattern? (If not, we will use the positive
    // subpattern.)
    bool useNegativeAffixPattern = patternInfo.hasNegativeSubpattern() && (
            signum == -1 || (patternInfo.negativeHasMinusSign() && plusReplacesMinusSign));

    // Resolve the flags for the affix pattern.
    int flags = 0;
    if (useNegativeAffixPattern) {
        flags |= AffixPatternProvider::AFFIX_NEGATIVE_SUBPATTERN;
    }
    if (isPrefix) {
        flags |= AffixPatternProvider::AFFIX_PREFIX;
    }
    if (plural != StandardPlural::Form::COUNT) {
        U_ASSERT(plural == (AffixPatternProvider::AFFIX_PLURAL_MASK & plural));
        flags |= plural;
    }

    // Should we prepend a sign to the pattern?
    bool prependSign;
    if (!isPrefix || useNegativeAffixPattern) {
        prependSign = false;
    } else if (signum == -1) {
        prependSign = signDisplay != UNUM_SIGN_NEVER;
    } else {
        prependSign = plusReplacesMinusSign;
    }

    // Compute the length of the affix pattern.
    int length = patternInfo.length(flags) + (prependSign ? 1 : 0);

    // Finally, set the result into the StringBuilder.
    output.remove();
    for (int index = 0; index < length; index++) {
        char16_t candidate;
        if (prependSign && index == 0) {
            candidate = u'-';
        } else if (prependSign) {
            candidate = patternInfo.charAt(flags, index - 1);
        } else {
            candidate = patternInfo.charAt(flags, index);
        }
        if (plusReplacesMinusSign && candidate == u'-') {
            candidate = u'+';
        }
        if (perMilleReplacesPercent && candidate == u'%') {
            candidate = u'‰';
        }
        output.append(candidate);
    }
}